

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_dc_left_predictor_16x4_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  uint uVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  uint6 uVar12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [13];
  int iVar15;
  bool bVar16;
  ushort uVar17;
  undefined4 uVar18;
  ushort uVar28;
  ushort uVar29;
  undefined1 auVar19 [16];
  ushort uVar26;
  ushort uVar30;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 uVar25;
  byte bVar27;
  
  uVar1 = *(ulong *)left;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[10] = (char)(uVar1 >> 0x28);
  auVar5._11_4_ = auVar4._11_4_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = (char)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._9_6_ = auVar6._9_6_;
  auVar8._7_8_ = 0;
  auVar8._0_7_ = auVar7._8_7_;
  auVar10._1_8_ = SUB158(auVar8 << 0x40,7);
  auVar10[0] = (char)(uVar1 >> 0x18);
  auVar10._9_6_ = 0;
  auVar11._1_10_ = SUB1510(auVar10 << 0x30,5);
  auVar11[0] = (char)(uVar1 >> 0x10);
  auVar11._11_4_ = 0;
  auVar19._3_12_ = SUB1512(auVar11 << 0x20,3);
  auVar19[2] = (char)(uVar1 >> 8);
  auVar19[0] = (byte)uVar1;
  auVar19[1] = 0;
  auVar19[0xf] = 0;
  auVar19 = psadbw(auVar19,(undefined1  [16])0x0);
  uVar17 = auVar19._0_2_ + 2;
  uVar26 = auVar19._2_2_ + 2;
  uVar28 = auVar19._4_2_ + 2;
  uVar29 = auVar19._6_2_ + 2;
  auVar21._0_2_ = uVar17 >> 2;
  uVar30 = uVar29 >> 2;
  uVar9 = CONCAT22((ushort)(auVar19._8_2_ + 2U) >> 2,uVar30);
  auVar22._0_9_ = (unkuint9)uVar9 << 0x30;
  uVar12 = CONCAT24((ushort)(auVar19._10_2_ + 2U) >> 2,uVar9);
  auVar13._6_5_ = 0;
  auVar13._0_6_ = uVar12;
  auVar23._0_11_ = auVar13 << 0x30;
  uVar1 = CONCAT26((ushort)(auVar19._12_2_ + 2U) >> 2,uVar12);
  auVar14._8_5_ = 0;
  auVar14._0_8_ = uVar1;
  auVar24._0_13_ = auVar14 << 0x30;
  bVar27 = (byte)(uVar29 >> 8);
  auVar24._14_2_ = (undefined2)(CONCAT19(bVar27 >> 2,CONCAT18(bVar27 >> 2,uVar1)) >> 0x40);
  auVar24[0xd] = (char)uVar30;
  bVar27 = (byte)(uVar28 >> 10);
  auVar23._12_4_ = (undefined4)(CONCAT37(auVar24._13_3_,CONCAT16((char)uVar30,uVar12)) >> 0x30);
  auVar23[0xb] = bVar27;
  uVar25 = (undefined1)(uVar28 >> 2);
  auVar22._10_6_ = (undefined6)(CONCAT55(auVar23._11_5_,CONCAT14(bVar27,uVar9)) >> 0x20);
  auVar22[9] = uVar25;
  bVar27 = (byte)(uVar26 >> 10);
  auVar21._8_8_ = (undefined8)(CONCAT73(auVar22._9_7_,CONCAT12(uVar25,uVar30)) >> 0x10);
  auVar21[7] = bVar27;
  auVar21[6] = bVar27;
  uVar25 = (undefined1)(uVar26 >> 2);
  auVar21[5] = uVar25;
  auVar21[4] = uVar25;
  bVar27 = (byte)(uVar17 >> 8);
  auVar21[3] = bVar27 >> 2;
  auVar21[2] = bVar27 >> 2;
  auVar20[0] = (undefined1)auVar21._0_2_;
  auVar20._2_14_ = auVar21._2_14_;
  auVar20[1] = auVar20[0];
  auVar19 = pshuflw(auVar20,auVar20,0);
  uVar18 = auVar19._0_4_;
  iVar15 = 4;
  while (bVar16 = iVar15 != 0, iVar15 = iVar15 + -1, bVar16) {
    *(undefined4 *)dst = uVar18;
    *(undefined4 *)(dst + 4) = uVar18;
    *(undefined4 *)(dst + 8) = uVar18;
    *(undefined4 *)(dst + 0xc) = uVar18;
    dst = dst + stride;
  }
  return;
}

Assistant:

void aom_dc_left_predictor_16x4_sse2(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  (void)above;
  __m128i sum_left = dc_sum_4(left);
  const __m128i two = _mm_set1_epi16(2);
  sum_left = _mm_add_epi16(sum_left, two);
  sum_left = _mm_srai_epi16(sum_left, 2);
  sum_left = _mm_unpacklo_epi8(sum_left, sum_left);
  sum_left = _mm_shufflelo_epi16(sum_left, 0);
  const __m128i row = _mm_unpacklo_epi64(sum_left, sum_left);
  dc_store_16xh(&row, 4, dst, stride);
}